

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  int in_stack_fffffffffffffdbc;
  Mat *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  Mat *in_stack_fffffffffffffdd8;
  Mat *pMVar3;
  ParamDict *in_stack_fffffffffffffde0;
  Option *in_stack_fffffffffffffdf0;
  Mat *pMVar4;
  Mat *in_stack_fffffffffffffdf8;
  Mat *in_stack_fffffffffffffe00;
  Mat *local_1d8;
  undefined1 local_1a8 [16];
  Mat local_198 [2];
  undefined1 local_108 [32];
  Mat local_e8;
  undefined4 local_a0;
  Mat local_90;
  int local_48;
  int local_44;
  reference local_40;
  const_reference local_38;
  const_reference local_30;
  undefined8 local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  local_44 = local_38->w;
  local_48 = local_38->c * local_38->elempack;
  Mat::Mat(&local_90);
  flatten(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  bVar2 = Mat::empty(in_stack_fffffffffffffdc0);
  if (bVar2) {
    local_4 = -100;
    local_a0 = 1;
    goto LAB_0095c782;
  }
  local_90.w = local_90.w * local_90.elempack;
  local_90.elemsize = local_90.elemsize / (ulong)(long)local_90.elempack;
  local_90.elempack = 1;
  Mat::Mat(&local_e8);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == 0) {
LAB_0095c2de:
    local_108._16_8_ = create_layer(in_stack_fffffffffffffdcc);
    ParamDict::ParamDict(in_stack_fffffffffffffde0);
    ParamDict::set((ParamDict *)local_108,0,local_48);
    ParamDict::set((ParamDict *)local_108,1,local_44);
    ParamDict::set((ParamDict *)local_108,2,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
    ParamDict::set((ParamDict *)local_108,3,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
    ParamDict::set((ParamDict *)local_108,4,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
    ParamDict::set((ParamDict *)local_108,0xf,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4));
    ParamDict::set((ParamDict *)local_108,0x12,
                   *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
    ParamDict::set((ParamDict *)local_108,5,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec));
    ParamDict::set((ParamDict *)local_108,6,local_90.w);
    ParamDict::set((ParamDict *)local_108,9,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4));
    ParamDict::set((ParamDict *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,(Mat *)0x95c4aa)
    ;
    (*(*(_func_int ***)local_108._16_8_)[2])(local_108._16_8_,local_108);
    local_1d8 = local_198;
    do {
      Mat::Mat(local_1d8);
      local_1d8 = local_1d8 + 1;
    } while (local_1d8 != (Mat *)local_108);
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
    uVar1 = local_108._16_8_;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    (*(*(_func_int ***)uVar1)[3])(uVar1,local_1a8);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffdc0);
    (*(*(_func_int ***)local_108._16_8_)[4])(local_108._16_8_,local_28);
    (*(*(_func_int ***)local_108._16_8_)[7])(local_108._16_8_,local_30,local_40,local_28);
    (*(*(_func_int ***)local_108._16_8_)[5])(local_108._16_8_,local_28);
    if ((Layer *)local_108._16_8_ != (Layer *)0x0) {
      (*(*(_func_int ***)local_108._16_8_)[1])();
    }
    local_4 = 0;
    local_a0 = 1;
    pMVar4 = local_198;
    pMVar3 = (Mat *)local_108;
    do {
      pMVar3 = pMVar3 + -1;
      Mat::~Mat((Mat *)0x95c6f1);
    } while (pMVar3 != pMVar4);
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffdc0);
  }
  else {
    local_108._24_8_ = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
    flatten(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    bVar2 = Mat::empty(in_stack_fffffffffffffdc0);
    if (!bVar2) {
      local_e8.w = local_e8.elempack * local_e8.w;
      local_e8.elemsize = local_e8.elemsize / (ulong)(long)local_e8.elempack;
      local_e8.elempack = 1;
      goto LAB_0095c2de;
    }
    local_4 = -100;
    local_a0 = 1;
  }
  Mat::~Mat((Mat *)0x95c771);
LAB_0095c782:
  Mat::~Mat((Mat *)0x95c78f);
  return local_4;
}

Assistant:

int Convolution1D_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution1D);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(2, dilation_w);
    pd.set(3, stride_w);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}